

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# betti.h
# Opt level: O0

void __thiscall
betti_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
::print_aggregated_results
          (betti_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
           *this)

{
  long in_RDI;
  bool in_stack_0000003e;
  bool in_stack_0000003f;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000040;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000048;
  int in_stack_00000054;
  int in_stack_00000058;
  int in_stack_0000005c;
  ostream *in_stack_00000060;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000070;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffa8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffb0;
  
  if ((*(byte *)(in_RDI + 0x24d) & 1) != 0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&total_cell_count);
    print_ordinary(in_stack_00000060,in_stack_0000005c,in_stack_00000058,in_stack_00000054,
                   in_stack_00000048,in_stack_00000040,in_stack_00000070,in_stack_0000003f,
                   in_stack_0000003e);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_ffffffffffffff70);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_ffffffffffffff70);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_ffffffffffffff70);
  }
  return;
}

Assistant:

void betti_output_t<Complex>::print_aggregated_results() {
	if (!aggregate_results) return;

	print_ordinary(file_output_t<Complex>::outstream, int(min_dimension), int(max_dimension), int(total_top_dimension),
	               total_cell_count, total_betti, total_skipped, approximate_computation, total_cell_count.size() > 0);
}